

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbolNoPlaceholder
          (DescriptorBuilder *this,string *name,string *relative_to,ResolveMode resolve_mode,
          bool build_it)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  size_type old_size;
  size_type dot_pos;
  string scope_to_try;
  string local_88 [8];
  string first_part_of_name;
  size_type name_dot_pos;
  string local_50;
  byte local_2d;
  ResolveMode local_2c;
  bool build_it_local;
  string *psStack_28;
  ResolveMode resolve_mode_local;
  string *relative_to_local;
  string *name_local;
  DescriptorBuilder *this_local;
  Symbol result;
  
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  local_2d = build_it;
  local_2c = resolve_mode;
  psStack_28 = relative_to;
  relative_to_local = name;
  name_local = (string *)this;
  std::__cxx11::string::clear();
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)relative_to_local), *pcVar4 == '.'))
  {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)relative_to_local);
    this_local = (DescriptorBuilder *)FindSymbol(this,&local_50,(bool)(local_2d & 1));
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    first_part_of_name.field_2._8_8_ =
         std::__cxx11::string::find_first_of((char)relative_to_local,0x2e);
    std::__cxx11::string::string(local_88);
    if (first_part_of_name.field_2._8_8_ == -1) {
      std::__cxx11::string::operator=(local_88,(string *)relative_to_local);
    }
    else {
      std::__cxx11::string::substr
                ((ulong)((long)&scope_to_try.field_2 + 8),(ulong)relative_to_local);
      std::__cxx11::string::operator=(local_88,(string *)(scope_to_try.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(scope_to_try.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::string((string *)&dot_pos,(string *)psStack_28);
    while (uVar3 = std::__cxx11::string::find_last_of((char)&dot_pos,0x2e),
          uVar3 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)&dot_pos,uVar3);
      uVar3 = std::__cxx11::string::size();
      std::__cxx11::string::append((ulong)&dot_pos,'\x01');
      std::__cxx11::string::append((string *)&dot_pos);
      this_local = (DescriptorBuilder *)FindSymbol(this,(string *)&dot_pos,(bool)(local_2d & 1));
      bVar2 = Symbol::IsNull((Symbol *)&this_local);
      if (!bVar2) {
        uVar5 = std::__cxx11::string::size();
        uVar6 = std::__cxx11::string::size();
        if (uVar5 < uVar6) {
          bVar2 = Symbol::IsAggregate((Symbol *)&this_local);
          psVar1 = relative_to_local;
          if (bVar2) {
            uVar3 = std::__cxx11::string::size();
            std::__cxx11::string::size();
            std::__cxx11::string::size();
            std::__cxx11::string::append((string *)&dot_pos,(ulong)psVar1,uVar3);
            this_local = (DescriptorBuilder *)
                         FindSymbol(this,(string *)&dot_pos,(bool)(local_2d & 1));
            bVar2 = Symbol::IsNull((Symbol *)&this_local);
            if (bVar2) {
              std::__cxx11::string::operator=
                        ((string *)&this->undefine_resolved_name_,(string *)&dot_pos);
            }
            goto LAB_00656d72;
          }
        }
        else if ((local_2c != LOOKUP_TYPES) ||
                (bVar2 = Symbol::IsType((Symbol *)&this_local), bVar2)) goto LAB_00656d72;
      }
      std::__cxx11::string::erase((ulong)&dot_pos,uVar3);
    }
    this_local = (DescriptorBuilder *)FindSymbol(this,relative_to_local,(bool)(local_2d & 1));
LAB_00656d72:
    std::__cxx11::string::~string((string *)&dot_pos);
    std::__cxx11::string::~string(local_88);
  }
  return (Symbol)(SymbolBase *)this_local;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbolNoPlaceholder(
    const std::string& name, const std::string& relative_to,
    ResolveMode resolve_mode, bool build_it) {
  possible_undeclared_dependency_ = nullptr;
  undefine_resolved_name_.clear();

  if (!name.empty() && name[0] == '.') {
    // Fully-qualified name.
    return FindSymbol(name.substr(1), build_it);
  }

  // If name is something like "Foo.Bar.baz", and symbols named "Foo" are
  // defined in multiple parent scopes, we only want to find "Bar.baz" in the
  // innermost one.  E.g., the following should produce an error:
  //   message Bar { message Baz {} }
  //   message Foo {
  //     message Bar {
  //     }
  //     optional Bar.Baz baz = 1;
  //   }
  // So, we look for just "Foo" first, then look for "Bar.baz" within it if
  // found.
  std::string::size_type name_dot_pos = name.find_first_of('.');
  std::string first_part_of_name;
  if (name_dot_pos == std::string::npos) {
    first_part_of_name = name;
  } else {
    first_part_of_name = name.substr(0, name_dot_pos);
  }

  std::string scope_to_try(relative_to);

  while (true) {
    // Chop off the last component of the scope.
    std::string::size_type dot_pos = scope_to_try.find_last_of('.');
    if (dot_pos == std::string::npos) {
      return FindSymbol(name, build_it);
    } else {
      scope_to_try.erase(dot_pos);
    }

    // Append ".first_part_of_name" and try to find.
    std::string::size_type old_size = scope_to_try.size();
    scope_to_try.append(1, '.');
    scope_to_try.append(first_part_of_name);
    Symbol result = FindSymbol(scope_to_try, build_it);
    if (!result.IsNull()) {
      if (first_part_of_name.size() < name.size()) {
        // name is a compound symbol, of which we only found the first part.
        // Now try to look up the rest of it.
        if (result.IsAggregate()) {
          scope_to_try.append(name, first_part_of_name.size(),
                              name.size() - first_part_of_name.size());
          result = FindSymbol(scope_to_try, build_it);
          if (result.IsNull()) {
            undefine_resolved_name_ = scope_to_try;
          }
          return result;
        } else {
          // We found a symbol but it's not an aggregate.  Continue the loop.
        }
      } else {
        if (resolve_mode == LOOKUP_TYPES && !result.IsType()) {
          // We found a symbol but it's not a type.  Continue the loop.
        } else {
          return result;
        }
      }
    }

    // Not found.  Remove the name so we can try again.
    scope_to_try.erase(old_size);
  }
}